

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fse_compress.c
# Opt level: O0

size_t FSE_normalizeM2(short *norm,U32 tableLog,uint *count,size_t total,U32 maxSymbolValue)

{
  byte bVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  byte bVar5;
  U32 weight;
  U32 sEnd;
  U32 sStart;
  U64 end;
  U64 tmpTotal;
  U64 rStep;
  U64 mid;
  U64 vStepLog;
  uint local_48;
  U32 maxC;
  U32 maxV;
  U32 lowOne;
  U32 lowThreshold;
  U32 ToDistribute;
  U32 distributed;
  U32 s;
  short NOT_YET_ASSIGNED;
  size_t sStack_28;
  U32 maxSymbolValue_local;
  size_t total_local;
  uint *count_local;
  U32 tableLog_local;
  short *norm_local;
  
  lowThreshold = 0;
  bVar5 = (byte)tableLog;
  uVar3 = total * 3 >> (bVar5 + 1 & 0x3f);
  sStack_28 = total;
  for (ToDistribute = 0; ToDistribute <= maxSymbolValue; ToDistribute = ToDistribute + 1) {
    if (count[ToDistribute] == 0) {
      norm[ToDistribute] = 0;
    }
    else if ((uint)(total >> (bVar5 & 0x3f)) < count[ToDistribute]) {
      if ((uint)uVar3 < count[ToDistribute]) {
        norm[ToDistribute] = -2;
      }
      else {
        norm[ToDistribute] = 1;
        lowThreshold = lowThreshold + 1;
        sStack_28 = sStack_28 - count[ToDistribute];
      }
    }
    else {
      norm[ToDistribute] = -1;
      lowThreshold = lowThreshold + 1;
      sStack_28 = sStack_28 - count[ToDistribute];
    }
  }
  lowOne = (1 << (bVar5 & 0x1f)) - lowThreshold;
  if ((uVar3 & 0xffffffff) < sStack_28 / lowOne) {
    uVar3 = sStack_28 * 3;
    for (ToDistribute = 0; ToDistribute <= maxSymbolValue; ToDistribute = ToDistribute + 1) {
      if ((norm[ToDistribute] == -2) && (count[ToDistribute] <= (uint)(uVar3 / (lowOne * 2)))) {
        norm[ToDistribute] = 1;
        lowThreshold = lowThreshold + 1;
        sStack_28 = sStack_28 - count[ToDistribute];
      }
    }
    lowOne = (1 << (bVar5 & 0x1f)) - lowThreshold;
  }
  if (lowThreshold == maxSymbolValue + 1) {
    local_48 = 0;
    vStepLog._4_4_ = 0;
    for (ToDistribute = 0; ToDistribute <= maxSymbolValue; ToDistribute = ToDistribute + 1) {
      if (vStepLog._4_4_ < count[ToDistribute]) {
        local_48 = ToDistribute;
        vStepLog._4_4_ = count[ToDistribute];
      }
    }
    norm[local_48] = norm[local_48] + (short)lowOne;
  }
  else if (sStack_28 == 0) {
    ToDistribute = 0;
    while (lowOne != 0) {
      if (0 < norm[ToDistribute]) {
        lowOne = lowOne - 1;
        norm[ToDistribute] = norm[ToDistribute] + 1;
      }
      ToDistribute = (ToDistribute + 1) % (maxSymbolValue + 1);
    }
  }
  else {
    bVar1 = -bVar5 + 0x3e;
    end = (1L << (-bVar5 + 0x3d & 0x3f)) - 1;
    uVar3 = (1L << (bVar1 & 0x3f)) * (ulong)lowOne + end;
    for (ToDistribute = 0; ToDistribute <= maxSymbolValue; ToDistribute = ToDistribute + 1) {
      if (norm[ToDistribute] == -2) {
        uVar4 = end + (ulong)count[ToDistribute] * (uVar3 / sStack_28);
        iVar2 = (int)(uVar4 >> (bVar1 & 0x3f)) - (int)(end >> (bVar1 & 0x3f));
        if (iVar2 == 0) {
          return 0xffffffffffffffff;
        }
        norm[ToDistribute] = (short)iVar2;
        end = uVar4;
      }
    }
  }
  return 0;
}

Assistant:

static size_t FSE_normalizeM2(short* norm, U32 tableLog, const unsigned* count, size_t total, U32 maxSymbolValue)
{
    short const NOT_YET_ASSIGNED = -2;
    U32 s;
    U32 distributed = 0;
    U32 ToDistribute;

    /* Init */
    U32 const lowThreshold = (U32)(total >> tableLog);
    U32 lowOne = (U32)((total * 3) >> (tableLog + 1));

    for (s=0; s<=maxSymbolValue; s++) {
        if (count[s] == 0) {
            norm[s]=0;
            continue;
        }
        if (count[s] <= lowThreshold) {
            norm[s] = -1;
            distributed++;
            total -= count[s];
            continue;
        }
        if (count[s] <= lowOne) {
            norm[s] = 1;
            distributed++;
            total -= count[s];
            continue;
        }

        norm[s]=NOT_YET_ASSIGNED;
    }
    ToDistribute = (1 << tableLog) - distributed;

    if ((total / ToDistribute) > lowOne) {
        /* risk of rounding to zero */
        lowOne = (U32)((total * 3) / (ToDistribute * 2));
        for (s=0; s<=maxSymbolValue; s++) {
            if ((norm[s] == NOT_YET_ASSIGNED) && (count[s] <= lowOne)) {
                norm[s] = 1;
                distributed++;
                total -= count[s];
                continue;
        }   }
        ToDistribute = (1 << tableLog) - distributed;
    }

    if (distributed == maxSymbolValue+1) {
        /* all values are pretty poor;
           probably incompressible data (should have already been detected);
           find max, then give all remaining points to max */
        U32 maxV = 0, maxC = 0;
        for (s=0; s<=maxSymbolValue; s++)
            if (count[s] > maxC) { maxV=s; maxC=count[s]; }
        norm[maxV] += (short)ToDistribute;
        return 0;
    }

    if (total == 0) {
        /* all of the symbols were low enough for the lowOne or lowThreshold */
        for (s=0; ToDistribute > 0; s = (s+1)%(maxSymbolValue+1))
            if (norm[s] > 0) { ToDistribute--; norm[s]++; }
        return 0;
    }

    {   U64 const vStepLog = 62 - tableLog;
        U64 const mid = (1ULL << (vStepLog-1)) - 1;
        U64 const rStep = ((((U64)1<<vStepLog) * ToDistribute) + mid) / total;   /* scale on remaining */
        U64 tmpTotal = mid;
        for (s=0; s<=maxSymbolValue; s++) {
            if (norm[s]==NOT_YET_ASSIGNED) {
                U64 const end = tmpTotal + (count[s] * rStep);
                U32 const sStart = (U32)(tmpTotal >> vStepLog);
                U32 const sEnd = (U32)(end >> vStepLog);
                U32 const weight = sEnd - sStart;
                if (weight < 1)
                    return ERROR(GENERIC);
                norm[s] = (short)weight;
                tmpTotal = end;
    }   }   }

    return 0;
}